

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::EntryPointInfo::InstallGuards(EntryPointInfo *this,ScriptContext *scriptContext)

{
  Type *pTVar1;
  Type *addr;
  PropertyId propertyId;
  undefined4 uVar2;
  uint uVar3;
  uint sourceContextId;
  JitTransferData *pJVar4;
  ThreadContext *this_00;
  Type ppCVar5;
  ulong uVar6;
  code *pcVar7;
  Type TVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  NativeEntryPointData *this_01;
  NativeEntryPointData *pNVar14;
  undefined4 *puVar15;
  undefined4 extraout_var;
  undefined8 uVar16;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PropertyRecord *pPVar17;
  EquivalentTypeCache *pEVar18;
  ulong uVar19;
  Type *pTVar20;
  FakePropertyGuardWeakReference *pFVar21;
  JitPolyEquivalentTypeGuard *this_02;
  CtorCacheTransferEntryIDL *pCVar22;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  CtorCacheGuardTransferEntry this_03;
  int iVar23;
  EquivalentTypeCache *pEVar24;
  ulong uVar25;
  EquivalentTypeCache *pEVar26;
  EquivalentTypeCache *pEVar27;
  uint8 i;
  CtorCacheTransferEntryIDL **entries;
  Type pCVar28;
  Type pTVar29;
  JitEquivalentTypeGuard **guard;
  long lVar30;
  PropertyGuard *pPVar31;
  TypeGuardTransferEntry this_04;
  byte bVar32;
  PropertyGuard *local_498;
  WCHAR prefixValue [512];
  Type local_40;
  PropertyGuard *sharedPropertyGuard;
  
  bVar32 = 0;
  this_01 = GetNativeEntryPointData(this);
  pNVar14 = GetNativeEntryPointData(this);
  pJVar4 = (pNVar14->jitTransferData).ptr;
  if ((pJVar4 == (JitTransferData *)0x0) || (pJVar4->isReady == false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x20de,
                                "(jitTransferData != nullptr && jitTransferData->GetIsReady())",
                                "jitTransferData != nullptr && jitTransferData->GetIsReady()");
    if (!bVar9) goto LAB_0077e102;
    *puVar15 = 0;
  }
  if (0 < pJVar4->lazyBailoutPropertyCount) {
    sharedPropertyGuard = (PropertyGuard *)__tls_get_addr(&PTR_0155fe48);
    lVar30 = 0;
    do {
      if (pJVar4->lazyBailoutProperties == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        pPVar31 = sharedPropertyGuard;
        *(undefined4 *)&sharedPropertyGuard->value = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x20e2,"(jitTransferData->lazyBailoutProperties != nullptr)",
                                    "jitTransferData->lazyBailoutProperties != nullptr");
        if (!bVar9) goto LAB_0077e102;
        *(undefined4 *)&pPVar31->value = 0;
      }
      propertyId = pJVar4->lazyBailoutProperties[lVar30];
      local_40.ptr = (FakePropertyGuardWeakReference *)0x0;
      bVar9 = NativeEntryPointData::TryGetSharedPropertyGuard
                        (this_01,propertyId,(PropertyGuard **)&local_40);
      if (bVar9) {
LAB_0077d911:
        bVar9 = ((ulong)((local_40.ptr)->super_RecyclerWeakReference<Js::PropertyGuard>).
                        super_RecyclerWeakReferenceBase.strongRef & 0xfffffffffffffffd) != 0;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        pPVar31 = sharedPropertyGuard;
        *(undefined4 *)&sharedPropertyGuard->value = 1;
        bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                     ,0x20e7,"(hasSharedPropertyGuard)","hasSharedPropertyGuard");
        if (!bVar10) goto LAB_0077e102;
        *(undefined4 *)&pPVar31->value = 0;
        if (bVar9) goto LAB_0077d911;
        bVar9 = false;
      }
      if (bVar9) {
        ThreadContext::RegisterLazyBailout(scriptContext->threadContext,propertyId,this);
      }
      else {
        bVar10 = Phases::IsEnabled((Phases *)&DAT_015cd718,LazyBailoutPhase);
        if (bVar10) {
          iVar13 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          uVar16 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar13) + 0x38))
                             ((long *)CONCAT44(extraout_var,iVar13));
          iVar13 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          uVar2 = *(undefined4 *)
                   **(undefined8 **)(*(long *)(CONCAT44(extraout_var_00,iVar13) + 0x20) + 0x70);
          iVar13 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          if (*(long *)(CONCAT44(extraout_var_01,iVar13) + 0x10) == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pPVar31 = sharedPropertyGuard;
            *(undefined4 *)&sharedPropertyGuard->value = 1;
            bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
            if (!bVar10) goto LAB_0077e102;
            *(undefined4 *)&pPVar31->value = 0;
          }
          uVar3 = *(uint *)(*(long *)(CONCAT44(extraout_var_01,iVar13) + 0x10) + 0x10);
          iVar13 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject
                     .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
          swprintf_s<512ul>((WCHAR (*) [512])&local_498,L"Function %s (#%d.%u, #%u)",uVar16,uVar2,
                            (ulong)uVar3,(ulong)*(uint *)(CONCAT44(extraout_var_02,iVar13) + 0x40));
          pPVar17 = ScriptContext::GetPropertyName(scriptContext,propertyId);
          Output::TraceWithPrefix
                    (LazyBailoutPhase,(char16 *)&local_498,
                     L"Lazy bailout - Invalidation due to property: %s \n",pPVar17 + 1);
        }
        (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xd])(this,1);
      }
      if (!bVar9) {
        return;
      }
      lVar30 = lVar30 + 1;
    } while (lVar30 < pJVar4->lazyBailoutPropertyCount);
  }
  if (0 < pJVar4->equivalentTypeGuardCount) {
    if (pJVar4->equivalentTypeGuardOffsets != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x20f9,"(jitTransferData->equivalentTypeGuardOffsets == nullptr)"
                                  ,"jitTransferData->equivalentTypeGuardOffsets == nullptr");
      if (!bVar9) goto LAB_0077e102;
      *puVar15 = 0;
    }
    if (pJVar4->equivalentTypeGuards == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x20fa,"(jitTransferData->equivalentTypeGuards != nullptr)",
                                  "jitTransferData->equivalentTypeGuards != nullptr");
      if (!bVar9) goto LAB_0077e102;
      *puVar15 = 0;
    }
    iVar13 = pJVar4->equivalentTypeGuardCount;
    pPVar31 = (PropertyGuard *)pJVar4->equivalentTypeGuards;
    pEVar18 = NativeEntryPointData::EnsureEquivalentTypeCache(this_01,iVar13,scriptContext,this);
    sharedPropertyGuard = (PropertyGuard *)(&pPVar31->value + iVar13);
    if (pPVar31 < sharedPropertyGuard) {
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_0077db8f:
      pEVar24 = ((JitEquivalentTypeGuard *)pPVar31->value)->cache;
      pEVar26 = pEVar24;
      pEVar27 = pEVar18;
      for (lVar30 = 0xb; lVar30 != 0; lVar30 = lVar30 + -1) {
        pEVar27->types[0] = pEVar26->types[0];
        pEVar26 = (EquivalentTypeCache *)((long)pEVar26 + (ulong)bVar32 * -0x10 + 8);
        pEVar27 = (EquivalentTypeCache *)((long)pEVar27 + (ulong)bVar32 * -0x10 + 8);
      }
      bVar9 = pEVar24->hasFixedValue;
      pEVar18->isLoadedFromProto = pEVar24->isLoadedFromProto;
      pEVar18->hasFixedValue = bVar9;
      pEVar18->nextEvictionVictim = pEVar24->nextEvictionVictim;
      ((JitEquivalentTypeGuard *)pPVar31->value)->cache = pEVar18;
      lVar30 = 8;
      uVar19 = 0;
      pEVar24 = pEVar18;
      do {
        if (pEVar18->types[uVar19] == (Type *)0x0) {
          if (uVar19 < 8) goto LAB_0077dbec;
          break;
        }
        pTVar1 = &pEVar18->types[uVar19]->flags;
        *pTVar1 = *pTVar1 | TypeFlagMask_HasBeenCached;
        uVar19 = uVar19 + 1;
        pEVar24 = (EquivalentTypeCache *)(pEVar24->types + 1);
        lVar30 = lVar30 + -1;
      } while (uVar19 != 8);
      goto LAB_0077dc3e;
    }
  }
LAB_0077dc50:
  if (pJVar4->propertyGuardsByPropertyId != (Type)0x0) {
    iVar13 = pJVar4->propertyGuardCount;
    pTVar20 = NativeEntryPointData::EnsurePropertyGuardWeakRefs
                        (this_01,iVar13,scriptContext->recycler);
    pTVar29 = pJVar4->propertyGuardsByPropertyId;
    iVar23 = pTVar29->propertyId;
    if (iVar23 != -1) {
      this_00 = scriptContext->threadContext;
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        local_498 = (PropertyGuard *)0x0;
        bVar9 = NativeEntryPointData::TryGetSharedPropertyGuard(this_01,iVar23,&local_498);
        sharedPropertyGuard = (PropertyGuard *)CONCAT71(sharedPropertyGuard._1_7_,bVar9);
        if (bVar9) {
          bVar9 = (local_498->value & 0xfffffffffffffffdU) != 0;
        }
        else {
          bVar9 = false;
        }
        this_04 = pTVar29[1];
        pTVar29 = pTVar29 + 1;
        if (this_04 == (TypeGuardTransferEntry)0x0) {
          lVar30 = 1;
        }
        else {
          iVar12 = 0;
          prefixValue._1016_8_ = pTVar29;
          do {
            iVar11 = iVar12;
            if ((char)sharedPropertyGuard != '\0') {
              lVar30 = (long)*(int *)((long)this_04 + 0xc);
              if ((lVar30 < 0) || (iVar13 <= *(int *)((long)this_04 + 0xc))) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar15 = 1;
                bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                             ,0x2187,
                                             "(guardIndex >= 0 && guardIndex < propertyGuardCount)",
                                             "guardIndex >= 0 && guardIndex < propertyGuardCount");
                if (!bVar10) goto LAB_0077e102;
                *puVar15 = 0;
              }
              if (bVar9) {
                pFVar21 = pTVar20[lVar30].ptr;
                Memory::Recycler::WBSetBit((char *)&local_40);
                local_40.ptr = pFVar21;
                Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
                if (local_40.ptr == (FakePropertyGuardWeakReference *)0x0) {
                  addr = pTVar20 + lVar30;
                  pFVar21 = FakePropertyGuardWeakReference::New
                                      (scriptContext->recycler,(PropertyGuard *)this_04);
                  Memory::Recycler::WBSetBit((char *)&local_40);
                  local_40.ptr = pFVar21;
                  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
                  TVar8.ptr = local_40.ptr;
                  Memory::Recycler::WBSetBit((char *)addr);
                  addr->ptr = TVar8.ptr;
                  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
                }
                pTVar29 = (Type)prefixValue._1016_8_;
                if ((TypeGuardTransferEntry)
                    ((local_40.ptr)->super_RecyclerWeakReference<Js::PropertyGuard>).
                    super_RecyclerWeakReferenceBase.strongRef != this_04) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar15 = 1;
                  bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                               ,0x2192,"(propertyGuardWeakRef->Get() == guard)",
                                               "propertyGuardWeakRef->Get() == guard");
                  if (!bVar10) goto LAB_0077e102;
                  *puVar15 = 0;
                }
                ThreadContext::RegisterUniquePropertyGuard
                          (this_00,iVar23,
                           &(local_40.ptr)->super_RecyclerWeakReference<Js::PropertyGuard>);
              }
              else {
                *(undefined8 *)this_04 = 0;
                if (*(char *)((long)this_04 + 8) == '\x01') {
                  this_02 = PropertyGuard::AsPolyTypeCheckGuard((PropertyGuard *)this_04);
                  i = '\0';
                  do {
                    JitPolyEquivalentTypeGuard::Invalidate(this_02,i);
                    i = i + '\x01';
                  } while (i != '\b');
                }
              }
            }
            iVar12 = iVar11 + 1;
            this_04 = pTVar29[iVar12];
          } while (this_04 != (TypeGuardTransferEntry)0x0);
          lVar30 = (long)(iVar11 + 2);
        }
        pTVar29 = pTVar29 + lVar30;
        iVar23 = pTVar29->propertyId;
      } while (iVar23 != -1);
    }
  }
  ppCVar5 = (pJVar4->ctorCacheTransferData).entries;
  if ((ppCVar5 != (Type)0x0) && ((pJVar4->ctorCacheTransferData).ctorCachesCount != 0)) {
    sharedPropertyGuard = (PropertyGuard *)scriptContext->threadContext;
    uVar19 = 0;
    do {
      uVar3 = ppCVar5[uVar19]->propId;
      local_498 = (PropertyGuard *)0x0;
      bVar9 = NativeEntryPointData::TryGetSharedPropertyGuard(this_01,uVar3,&local_498);
      if (bVar9) {
        uVar6 = local_498->value;
        pCVar22 = ppCVar5[uVar19];
        if (pCVar22->cacheCount != 0) {
          uVar25 = 0;
          do {
            if ((uVar6 & 0xfffffffffffffffd) == 0) {
              ConstructorCache::InvalidateAsGuard((ConstructorCache *)pCVar22[uVar25 + 1]);
            }
            else {
              ThreadContext::RegisterConstructorCache
                        ((ThreadContext *)sharedPropertyGuard,uVar3,
                         (ConstructorCache *)pCVar22[uVar25 + 1]);
            }
            uVar25 = uVar25 + 1;
            pCVar22 = ppCVar5[uVar19];
          } while (uVar25 < pCVar22->cacheCount);
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < (pJVar4->ctorCacheTransferData).ctorCachesCount);
  }
  pCVar28 = pJVar4->ctorCacheGuardsByPropertyId;
  if ((pCVar28 != (Type)0x0) && (iVar13 = pCVar28->propertyId, iVar13 != -1)) {
    sharedPropertyGuard = (PropertyGuard *)scriptContext->threadContext;
    do {
      local_498 = (PropertyGuard *)0x0;
      bVar9 = NativeEntryPointData::TryGetSharedPropertyGuard(this_01,iVar13,&local_498);
      if (bVar9) {
        bVar10 = (local_498->value & 0xfffffffffffffffdU) != 0;
      }
      else {
        bVar10 = false;
      }
      this_03 = pCVar28[1];
      if (this_03 == (CtorCacheGuardTransferEntry)0x0) {
        lVar30 = 1;
      }
      else {
        iVar23 = 1;
        do {
          if (bVar9) {
            if (bVar10) {
              ThreadContext::RegisterConstructorCache
                        ((ThreadContext *)sharedPropertyGuard,iVar13,(ConstructorCache *)this_03);
            }
            else {
              ConstructorCache::InvalidateAsGuard((ConstructorCache *)this_03);
            }
          }
          this_03 = pCVar28[(long)iVar23 + 1];
          iVar23 = iVar23 + 1;
        } while (this_03 != (CtorCacheGuardTransferEntry)0x0);
        lVar30 = (long)iVar23;
      }
      pCVar28 = pCVar28 + lVar30 + 1;
      iVar13 = pCVar28->propertyId;
    } while (iVar13 != -1);
  }
  iVar13 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
  sourceContextId =
       *(uint *)**(undefined8 **)(*(long *)(CONCAT44(extraout_var_03,iVar13) + 0x20) + 0x70);
  iVar13 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
  if (*(long *)(CONCAT44(extraout_var_04,iVar13) + 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar9) {
LAB_0077e102:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar15 = 0;
  }
  bVar9 = Phases::IsEnabled((Phases *)&DAT_015c1bd0,FailNativeCodeInstallPhase,sourceContextId,
                            *(LocalFunctionId *)
                             (*(long *)(CONCAT44(extraout_var_04,iVar13) + 0x10) + 0x10));
  if (!bVar9) {
    return;
  }
  Throw::OutOfMemory();
LAB_0077dbec:
  do {
    if (pEVar24->types[0] != (Type *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar15 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x2115,"((*cache).types[__i] == nullptr)",
                                  "(*cache).types[__i] == nullptr");
      if (!bVar9) goto LAB_0077e102;
      *puVar15 = 0;
    }
    pEVar24 = (EquivalentTypeCache *)(pEVar24->types + 1);
    lVar30 = lVar30 + -1;
  } while (lVar30 != 0);
LAB_0077dc3e:
  pEVar18 = pEVar18 + 1;
  pPVar31 = (PropertyGuard *)&pPVar31->isPoly;
  if (sharedPropertyGuard <= pPVar31) goto LAB_0077dc50;
  goto LAB_0077db8f;
}

Assistant:

void EntryPointInfo::InstallGuards(ScriptContext* scriptContext)
    {
        NativeEntryPointData * nativeEntryPointData = this->GetNativeEntryPointData();
        JitTransferData * jitTransferData = this->GetNativeEntryPointData()->GetJitTransferData();
        Assert(jitTransferData != nullptr && jitTransferData->GetIsReady());

        for (int i = 0; i < jitTransferData->lazyBailoutPropertyCount; i++)
        {
            Assert(jitTransferData->lazyBailoutProperties != nullptr);

            Js::PropertyId propertyId = jitTransferData->lazyBailoutProperties[i];
            Js::PropertyGuard* sharedPropertyGuard = nullptr;
            bool hasSharedPropertyGuard = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
            Assert(hasSharedPropertyGuard);
            bool isValid = hasSharedPropertyGuard && sharedPropertyGuard->IsValid();
            if (isValid)
            {
                scriptContext->GetThreadContext()->RegisterLazyBailout(propertyId, this);
            }
            else
            {
                OUTPUT_TRACE2(Js::LazyBailoutPhase, this->GetFunctionBody(), _u("Lazy bailout - Invalidation due to property: %s \n"), scriptContext->GetPropertyName(propertyId)->GetBuffer());
                this->Invalidate(true);
                return;
            }
        }


        // in-proc JIT
        if (jitTransferData->equivalentTypeGuardCount > 0)
        {
            Assert(jitTransferData->equivalentTypeGuardOffsets == nullptr);
            Assert(jitTransferData->equivalentTypeGuards != nullptr);

            int guardCount = jitTransferData->equivalentTypeGuardCount;
            JitEquivalentTypeGuard** guards = jitTransferData->equivalentTypeGuards;

            EquivalentTypeCache * cache = nativeEntryPointData->EnsureEquivalentTypeCache(guardCount, scriptContext, this);

            for (JitEquivalentTypeGuard** guard = guards; guard < guards + guardCount; guard++)
            {
                EquivalentTypeCache* oldCache = (*guard)->GetCache();
                // Copy the contents of the heap-allocated cache to the recycler-allocated version to make sure the types are
                // kept alive. Allow the properties pointer to refer to the heap-allocated arrays. It will stay alive as long
                // as the entry point is alive, and property entries contain no pointers to other recycler allocated objects.
                (*cache) = (*oldCache);
                // Set the recycler-allocated cache on the (heap-allocated) guard.
                (*guard)->SetCache(cache);

                for (uint i = 0; i < EQUIVALENT_TYPE_CACHE_SIZE; i++)
                {
                    if((*cache).types[i] != nullptr)
                    {
                        (*cache).types[i]->SetHasBeenCached();
                    }
                    else
                    {
#ifdef DEBUG
                        for (uint __i = i; __i < EQUIVALENT_TYPE_CACHE_SIZE; __i++)
                        { Assert((*cache).types[__i] == nullptr); }
#endif
                        break; // type array must be shrinked.
                    }
                }
                cache++;
            }
        }

#if ENABLE_OOP_NATIVE_CODEGEN
        if (jitTransferData->equivalentTypeGuardOffsets)
        {
            // InstallGuards
            int guardCount = jitTransferData->equivalentTypeGuardOffsets->count;
            EquivalentTypeCache* cache = this->nativeEntryPointData->EnsureEquivalentTypeCache(guardCount, scriptContext, this);
            char * nativeDataBuffer = this->GetOOPNativeEntryPointData()->GetNativeDataBuffer();
            for (int i = 0; i < guardCount; i++)
            {
                auto& cacheIDL = jitTransferData->equivalentTypeGuardOffsets->guards[i].cache;
                auto guardOffset = jitTransferData->equivalentTypeGuardOffsets->guards[i].offset;
                JitEquivalentTypeGuard* guard = (JitEquivalentTypeGuard*)(nativeDataBuffer + guardOffset);
                cache[i].guard = guard;
                cache[i].hasFixedValue = cacheIDL.hasFixedValue != 0;
                cache[i].isLoadedFromProto = cacheIDL.isLoadedFromProto != 0;
                cache[i].nextEvictionVictim = cacheIDL.nextEvictionVictim;
                cache[i].record.propertyCount = cacheIDL.record.propertyCount;
                cache[i].record.properties = (EquivalentPropertyEntry*)(nativeDataBuffer + cacheIDL.record.propertyOffset);
                for (int j = 0; j < EQUIVALENT_TYPE_CACHE_SIZE; j++)
                {
                    cache[i].types[j] = (Js::Type*)cacheIDL.types[j];
                }
                guard->SetCache(&cache[i]);
            }
        }

        // OOP JIT
        if (jitTransferData->typeGuardTransferData.entries != nullptr)
        {
            int propertyGuardCount = jitTransferData->typeGuardTransferData.propertyGuardCount;
            Field(FakePropertyGuardWeakReference*) * propertyGuardWeakRefs = this->nativeEntryPointData->EnsurePropertyGuardWeakRefs(propertyGuardCount, scriptContext->GetRecycler());
            ThreadContext* threadContext = scriptContext->GetThreadContext();
            auto next = &jitTransferData->typeGuardTransferData.entries;
            while (*next)
            {
                Js::PropertyId propertyId = (*next)->propId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                if (isNeeded)
                {
                    char * nativeDataBuffer = this->GetOOPNativeEntryPointData()->GetNativeDataBuffer();
                    for (unsigned int i = 0; i < (*next)->guardsCount; i++)
                    {
                        Js::JitIndexedPropertyGuard* guard = (Js::JitIndexedPropertyGuard*)(nativeDataBuffer + (*next)->guardOffsets[i]);
                        int guardIndex = guard->GetIndex();
                        Assert(guardIndex >= 0 && guardIndex < propertyGuardCount);
                        // We use the shared guard here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the guard here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            auto propertyGuardWeakRef = propertyGuardWeakRefs[guardIndex];
                            if (propertyGuardWeakRef == nullptr)
                            {
                                propertyGuardWeakRef = Js::FakePropertyGuardWeakReference::New(scriptContext->GetRecycler(), guard);
                                propertyGuardWeakRefs[guardIndex] = propertyGuardWeakRef;
                            }
                            Assert(propertyGuardWeakRef->Get() == guard);
                            threadContext->RegisterUniquePropertyGuard(propertyId, propertyGuardWeakRef);
                        }
                        else
                        {
                            guard->Invalidate();
                        }
                    }
                }
                *next = (*next)->next;
            }
        }
#endif

        // in-proc JIT
        // The propertyGuardsByPropertyId structure is temporary and serves only to register the type guards for the correct
        // properties.  If we've done code gen for this EntryPointInfo, typePropertyGuardsByPropertyId will have been used and nulled out.
        if (jitTransferData->propertyGuardsByPropertyId != nullptr)
        {
            int propertyGuardCount = jitTransferData->propertyGuardCount;
            Field(FakePropertyGuardWeakReference*) * propertyGuardWeakRefs = nativeEntryPointData->EnsurePropertyGuardWeakRefs(propertyGuardCount, scriptContext->GetRecycler());

            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Js::TypeGuardTransferEntry* entry = jitTransferData->propertyGuardsByPropertyId;
            while (entry->propertyId != Js::Constants::NoProperty)
            {
                Js::PropertyId propertyId = entry->propertyId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                int entryGuardIndex = 0;
                while (entry->guards[entryGuardIndex] != nullptr)
                {
                    if (isNeeded)
                    {
                        Js::JitIndexedPropertyGuard* guard = entry->guards[entryGuardIndex];
                        int guardIndex = guard->GetIndex();
                        Assert(guardIndex >= 0 && guardIndex < propertyGuardCount);
                        // We use the shared guard here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the guard here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            auto propertyGuardWeakRef = propertyGuardWeakRefs[guardIndex];
                            if (propertyGuardWeakRef == nullptr)
                            {
                                propertyGuardWeakRef = Js::FakePropertyGuardWeakReference::New(scriptContext->GetRecycler(), guard);
                                propertyGuardWeakRefs[guardIndex] = propertyGuardWeakRef;
                            }
                            Assert(propertyGuardWeakRef->Get() == guard);
                            threadContext->RegisterUniquePropertyGuard(propertyId, propertyGuardWeakRef);
                        }
                        else
                        {
                            guard->Invalidate();
                        }
                    }
                    entryGuardIndex++;
                }
                entry = reinterpret_cast<Js::TypeGuardTransferEntry*>(&entry->guards[++entryGuardIndex]);
            }
        }


        // The ctorCacheGuardsByPropertyId structure is temporary and serves only to register the constructor cache guards for the correct
        // properties.  If we've done code gen for this EntryPointInfo, ctorCacheGuardsByPropertyId will have been used and nulled out.
        // Unlike type property guards, constructor cache guards use the live constructor caches associated with function objects. These are
        // recycler allocated and are kept alive by the constructorCaches field, where they were inserted during work item creation.

        // OOP JIT
        if (jitTransferData->ctorCacheTransferData.entries != nullptr)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();

            CtorCacheTransferEntryIDL ** entries = jitTransferData->ctorCacheTransferData.entries;
            for (uint i = 0; i < jitTransferData->ctorCacheTransferData.ctorCachesCount; ++i)
            {
                Js::PropertyId propertyId = entries[i]->propId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;

                if (isNeeded)
                {
                    for (uint j = 0; j < entries[i]->cacheCount; ++j)
                    {
                        Js::ConstructorCache* cache = (Js::ConstructorCache*)(entries[i]->caches[j]);
                        // We use the shared cache here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the cache here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            threadContext->RegisterConstructorCache(propertyId, cache);
                        }
                        else
                        {
                            cache->InvalidateAsGuard();
                        }
                    }
                }
            }
        }

        if (jitTransferData->ctorCacheGuardsByPropertyId != nullptr)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Js::CtorCacheGuardTransferEntry* entry = jitTransferData->ctorCacheGuardsByPropertyId;
            while (entry->propertyId != Js::Constants::NoProperty)
            {
                Js::PropertyId propertyId = entry->propertyId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                int entryCacheIndex = 0;
                while (entry->caches[entryCacheIndex] != 0)
                {
                    if (isNeeded)
                    {
                        Js::ConstructorCache* cache = (Js::ConstructorCache*)(entry->caches[entryCacheIndex]);
                        // We use the shared cache here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the cache here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            threadContext->RegisterConstructorCache(propertyId, cache);
                        }
                        else
                        {
                            cache->InvalidateAsGuard();
                        }
                    }
                    entryCacheIndex++;
                }
                entry = reinterpret_cast<Js::CtorCacheGuardTransferEntry*>(&entry->caches[++entryCacheIndex]);
            }
        }

        if (PHASE_ON(Js::FailNativeCodeInstallPhase, this->GetFunctionBody()))
        {
            Js::Throw::OutOfMemory();
        }
    }